

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_func_call_arg_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Parameter *arg,uint32_t id)

{
  MSLFormatResolution MVar1;
  SPIRFunction *pSVar2;
  bool bVar3;
  SPIRType *type;
  SPIRType *pSVar4;
  SPIRConstant *pSVar5;
  TypedID<(spirv_cross::Types)0> *pTVar6;
  SPIRVariable *pSVar7;
  MSLConstexprSampler *pMVar8;
  size_type sVar9;
  CompilerError *pCVar10;
  uint32_t uVar11;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  uint *in_R9;
  byte bVar12;
  undefined4 uStack_1f8;
  uint32_t id_local;
  byte local_1ee;
  byte local_1ed;
  uint32_t var_id;
  string local_1e8;
  string *local_1c8;
  undefined1 local_1c0 [40];
  MSLConstexprSampler *local_198;
  SPIRType *local_190;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  samp_args;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  id_local = id;
  local_1c8 = __return_storage_ptr__;
  type = Compiler::expression_type((Compiler *)this,id);
  local_1ed = Compiler::has_extended_decoration
                        ((Compiler *)this,(arg->id).id,SPIRVCrossDecorationDynamicImageSampler);
  local_1c0._32_8_ = arg;
  bVar3 = Compiler::has_extended_decoration
                    ((Compiler *)this,id_local,SPIRVCrossDecorationDynamicImageSampler);
  bVar12 = local_1ed ^ 1;
  if (!bVar3 && bVar12 == 0) {
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(type->image).type.id);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (this->super_CompilerGLSL).super_Compiler._vptr_Compiler;
    (**(code **)((long)&in_R8[4].field_2 + 8))(&local_1e8,this,pSVar4,0);
    join<char_const(&)[24],std::__cxx11::string,char_const(&)[3]>
              ((string *)&samp_args,(spirv_cross *)"spvDynamicImageSampler<",
               (char (*) [24])&local_1e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31bc18,
               (char (*) [3])in_R8);
    ::std::__cxx11::string::operator=((string *)local_1c8,(string *)&samp_args);
    ::std::__cxx11::string::~string((string *)&samp_args);
    ::std::__cxx11::string::~string((string *)&local_1e8);
  }
  pSVar5 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,id_local);
  if (((pSVar5 == (SPIRConstant *)0x0) || ((this->msl_options).force_native_arrays == false)) ||
     (pSVar4 = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(pSVar5->super_IVariant).field_0xc),
     (pSVar4->array).super_VectorView<unsigned_int>.buffer_size == 0)) {
    CompilerGLSL::to_func_call_arg_abi_cxx11_
              ((string *)&samp_args,&this->super_CompilerGLSL,(Parameter *)local_1c0._32_8_,id_local
              );
    ::std::__cxx11::string::append((string *)local_1c8);
    ::std::__cxx11::string::~string((string *)&samp_args);
  }
  else {
    join<char_const(&)[2],unsigned_int&,char_const(&)[12]>
              ((string *)&samp_args,(spirv_cross *)0x30ed65,(char (*) [2])&id_local,
               (uint *)"_array_copy",(char (*) [12])in_R8);
    ::std::__cxx11::string::operator=((string *)local_1c8,(string *)&samp_args);
    ::std::__cxx11::string::~string((string *)&samp_args);
    pSVar2 = (this->super_CompilerGLSL).super_Compiler.current_function;
    pTVar6 = (pSVar2->constant_arrays_needed_on_stack).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    samp_args.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(samp_args.
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .ptr._4_4_,id_local);
    pTVar6 = ::std::
             __find_if<spirv_cross::TypedID<(spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)0>const>>
                       (pTVar6,pTVar6 + (pSVar2->constant_arrays_needed_on_stack).
                                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
                                        .buffer_size,&samp_args);
    if (pTVar6 == (pSVar2->constant_arrays_needed_on_stack).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr +
                  (pSVar2->constant_arrays_needed_on_stack).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size) {
      Compiler::force_recompile((Compiler *)this);
      samp_args.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(samp_args.
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .ptr._4_4_,id_local);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::push_back
                (&pSVar2->constant_arrays_needed_on_stack,
                 (TypedID<(spirv_cross::Types)0> *)&samp_args);
    }
  }
  var_id = 0;
  pSVar7 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,id_local);
  if (pSVar7 != (SPIRVariable *)0x0) {
    var_id = (pSVar7->basevariable).id;
  }
  if (bVar3) goto LAB_002a54a1;
  uVar11 = var_id;
  if (var_id == 0) {
    uVar11 = id_local;
  }
  pMVar8 = find_constexpr_sampler(this,uVar11);
  if (*(int *)&(type->super_IVariant).field_0xc == 0x11) {
    uVar11 = 1;
    local_190 = type;
    if (((pMVar8 != (MSLConstexprSampler *)0x0) && (pMVar8->ycbcr_conversion_enable == true)) &&
       (uVar11 = pMVar8->planes, *(bool *)(local_1c0._32_8_ + 0x10) == false)) {
      add_spv_func_and_recompile(this,SPVFuncImplDynamicImageSampler);
    }
    local_1ee = bVar12;
    local_198 = pMVar8;
    for (local_1c0._0_4_ = 1; type = local_190, pMVar8 = local_198, bVar12 = local_1ee,
        (uint)local_1c0._0_4_ < uVar11; local_1c0._0_4_ = local_1c0._0_4_ + 1) {
      CompilerGLSL::to_func_call_arg_abi_cxx11_
                (&local_1e8,&this->super_CompilerGLSL,(Parameter *)local_1c0._32_8_,id_local);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0;
      join<char_const(&)[3],std::__cxx11::string,std::__cxx11::string&,unsigned_int&>
                ((string *)&samp_args,(spirv_cross *)0x31b6f8,(char (*) [3])&local_1e8,
                 &this->plane_name_suffix,in_R8,in_R9);
      ::std::__cxx11::string::append((string *)local_1c8);
      ::std::__cxx11::string::~string((string *)&samp_args);
      ::std::__cxx11::string::~string((string *)&local_1e8);
    }
    if ((local_190->image).dim != DimBuffer) {
      uVar11 = var_id;
      if (var_id == 0) {
        uVar11 = id_local;
      }
      to_sampler_expression_abi_cxx11_(&local_1e8,this,uVar11);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &samp_args,", ",&local_1e8);
      ::std::__cxx11::string::append((string *)local_1c8);
      ::std::__cxx11::string::~string((string *)&samp_args);
      ::std::__cxx11::string::~string((string *)&local_1e8);
    }
    if ((pMVar8 == (MSLConstexprSampler *)0x0 || bVar12 != 0) ||
       (pMVar8->ycbcr_conversion_enable != true)) goto LAB_002a52d8;
    samp_args.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &samp_args.stack_storage;
    samp_args.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .buffer_size = 0;
    samp_args.buffer_capacity = 8;
    MVar1 = pMVar8->resolution;
    if (MVar1 != MSL_FORMAT_RESOLUTION_444) {
      if (MVar1 == MSL_FORMAT_RESOLUTION_420) {
        ::std::__cxx11::string::string
                  ((string *)&local_1e8,"spvFormatResolution::_420",(allocator *)local_1c0);
      }
      else {
        if (MVar1 != MSL_FORMAT_RESOLUTION_422) {
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_1e8,"Invalid format resolution.",(allocator *)local_1c0);
          CompilerError::CompilerError(pCVar10,&local_1e8);
          __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string
                  ((string *)&local_1e8,"spvFormatResolution::_422",(allocator *)local_1c0);
      }
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&samp_args,&local_1e8);
      ::std::__cxx11::string::~string((string *)&local_1e8);
    }
    if (pMVar8->chroma_filter != MSL_SAMPLER_FILTER_NEAREST) {
      ::std::__cxx11::string::string
                ((string *)&local_1e8,"spvChromaFilter::linear",(allocator *)local_1c0);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&samp_args,&local_1e8);
      ::std::__cxx11::string::~string((string *)&local_1e8);
    }
    if (pMVar8->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
      ::std::__cxx11::string::string
                ((string *)&local_1e8,"spvXChromaLocation::midpoint",(allocator *)local_1c0);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&samp_args,&local_1e8);
      ::std::__cxx11::string::~string((string *)&local_1e8);
    }
    if (pMVar8->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
      ::std::__cxx11::string::string
                ((string *)&local_1e8,"spvYChromaLocation::midpoint",(allocator *)local_1c0);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&samp_args,&local_1e8);
      ::std::__cxx11::string::~string((string *)&local_1e8);
    }
    switch(pMVar8->ycbcr_model) {
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
      goto switchD_002a518c_caseD_0;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
      ::std::__cxx11::string::string
                ((string *)&local_1e8,"spvYCbCrModelConversion::ycbcr_identity",
                 (allocator *)local_1c0);
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
      ::std::__cxx11::string::string
                ((string *)&local_1e8,"spvYCbCrModelConversion::ycbcr_bt_709",(allocator *)local_1c0
                );
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
      ::std::__cxx11::string::string
                ((string *)&local_1e8,"spvYCbCrModelConversion::ycbcr_bt_601",(allocator *)local_1c0
                );
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
      ::std::__cxx11::string::string
                ((string *)&local_1e8,"spvYCbCrModelConversion::ycbcr_bt_2020",
                 (allocator *)local_1c0);
      break;
    default:
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_1e8,"Invalid Y\'CbCr model conversion.",(allocator *)local_1c0);
      CompilerError::CompilerError(pCVar10,&local_1e8);
      __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&samp_args,&local_1e8);
    ::std::__cxx11::string::~string((string *)&local_1e8);
switchD_002a518c_caseD_0:
    if (pMVar8->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_FULL) {
      ::std::__cxx11::string::string
                ((string *)&local_1e8,"spvYCbCrRange::itu_narrow",(allocator *)local_1c0);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&samp_args,&local_1e8);
      ::std::__cxx11::string::~string((string *)&local_1e8);
    }
    join<char_const(&)[18],unsigned_int_const&,char_const(&)[2]>
              (&local_1e8,(spirv_cross *)"spvComponentBits(",(char (*) [18])&pMVar8->bpc,
               (uint *)0x30ae46,(char (*) [2])in_R8);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&samp_args,&local_1e8);
    ::std::__cxx11::string::~string((string *)&local_1e8);
    merge((string *)local_1c0,&samp_args,", ");
    join<char_const(&)[19],std::__cxx11::string,char_const(&)[2]>
              (&local_1e8,(spirv_cross *)", spvYCbCrSampler(",(char (*) [19])local_1c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ae46,
               (char (*) [2])in_R8);
    bVar12 = local_1ee;
    ::std::__cxx11::string::append((string *)local_1c8);
    ::std::__cxx11::string::~string((string *)&local_1e8);
    ::std::__cxx11::string::~string((string *)local_1c0);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::~SmallVector(&samp_args);
  }
LAB_002a52d8:
  if ((bVar12 == 0 && pMVar8 != (MSLConstexprSampler *)0x0) &&
     (pMVar8->ycbcr_conversion_enable == true)) {
    create_swizzle_abi_cxx11_(&local_1e8,pMVar8->swizzle[3]);
    create_swizzle_abi_cxx11_((string *)local_1c0,pMVar8->swizzle[2]);
    create_swizzle_abi_cxx11_(&local_50,pMVar8->swizzle[1]);
    create_swizzle_abi_cxx11_(&local_70,pMVar8->swizzle[0]);
    join<char_const(&)[9],std::__cxx11::string,char_const(&)[18],std::__cxx11::string,char_const(&)[18],std::__cxx11::string,char_const(&)[16],std::__cxx11::string,char_const(&)[2]>
              ((string *)&samp_args,(spirv_cross *)", (uint(",(char (*) [9])&local_1e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ") << 24) | (uint(",(char (*) [18])local_1c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ") << 16) | (uint(",(char (*) [18])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ") << 8) | uint(",(char (*) [16])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ae46,
               (char (*) [2])CONCAT44(id_local,uStack_1f8));
    ::std::__cxx11::string::append((string *)local_1c8);
    ::std::__cxx11::string::~string((string *)&samp_args);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
    this_00 = (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
               *)local_1c0;
LAB_002a5412:
    ::std::__cxx11::string::~string((string *)this_00);
    ::std::__cxx11::string::~string((string *)&local_1e8);
  }
  else if (((this->msl_options).swizzle_texture_samples == true) &&
          ((this->has_sampled_images == true &&
           (bVar3 = Compiler::is_sampled_image_type((Compiler *)this,type), bVar3)))) {
    uVar11 = var_id;
    if (var_id == 0) {
      uVar11 = id_local;
    }
    to_swizzle_expression_abi_cxx11_(&local_1e8,this,uVar11);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&samp_args
                     ,", ",&local_1e8);
    ::std::__cxx11::string::append((string *)local_1c8);
    this_00 = &samp_args;
    goto LAB_002a5412;
  }
  sVar9 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->buffers_requiring_array_length)._M_h,&var_id);
  if (sVar9 != 0) {
    uVar11 = var_id;
    if (var_id == 0) {
      uVar11 = id_local;
    }
    to_buffer_size_expression_abi_cxx11_(&local_1e8,this,uVar11);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&samp_args
                     ,", ",&local_1e8);
    ::std::__cxx11::string::append((string *)local_1c8);
    ::std::__cxx11::string::~string((string *)&samp_args);
    ::std::__cxx11::string::~string((string *)&local_1e8);
  }
  if (local_1ed != 0) {
    ::std::__cxx11::string::append((char *)local_1c8);
  }
LAB_002a54a1:
  pSVar7 = Compiler::maybe_get_backing_variable((Compiler *)this,var_id);
  if (pSVar7 != (SPIRVariable *)0x0) {
    samp_args.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(samp_args.
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .ptr._4_4_,(pSVar7->super_IVariant).self.id);
    sVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->atomic_image_vars)._M_h,(key_type *)&samp_args);
    if (sVar9 != 0) {
      CompilerGLSL::to_expression_abi_cxx11_
                ((string *)local_1c0,&this->super_CompilerGLSL,var_id,true);
      ::std::operator+(&local_1e8,", ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c0);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &samp_args,&local_1e8,"_atomic");
      ::std::__cxx11::string::append((string *)local_1c8);
      ::std::__cxx11::string::~string((string *)&samp_args);
      ::std::__cxx11::string::~string((string *)&local_1e8);
      ::std::__cxx11::string::~string((string *)local_1c0);
    }
  }
  return local_1c8;
}

Assistant:

string CompilerMSL::to_func_call_arg(const SPIRFunction::Parameter &arg, uint32_t id)
{
	string arg_str;

	auto &type = expression_type(id);
	bool is_dynamic_img_sampler = has_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	// If the argument *itself* is a "dynamic" combined-image sampler, then we can just pass that around.
	bool arg_is_dynamic_img_sampler = has_extended_decoration(id, SPIRVCrossDecorationDynamicImageSampler);
	if (is_dynamic_img_sampler && !arg_is_dynamic_img_sampler)
		arg_str = join("spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">(");

	auto *c = maybe_get<SPIRConstant>(id);
	if (msl_options.force_native_arrays && c && !get<SPIRType>(c->constant_type).array.empty())
	{
		// If we are passing a constant array directly to a function for some reason,
		// the callee will expect an argument in thread const address space
		// (since we can only bind to arrays with references in MSL).
		// To resolve this, we must emit a copy in this address space.
		// This kind of code gen should be rare enough that performance is not a real concern.
		// Inline the SPIR-V to avoid this kind of suboptimal codegen.
		//
		// We risk calling this inside a continue block (invalid code),
		// so just create a thread local copy in the current function.
		arg_str = join("_", id, "_array_copy");
		auto &constants = current_function->constant_arrays_needed_on_stack;
		auto itr = find(begin(constants), end(constants), ID(id));
		if (itr == end(constants))
		{
			force_recompile();
			constants.push_back(id);
		}
	}
	else
		arg_str += CompilerGLSL::to_func_call_arg(arg, id);

	// Need to check the base variable in case we need to apply a qualified alias.
	uint32_t var_id = 0;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var)
		var_id = var->basevariable;

	if (!arg_is_dynamic_img_sampler)
	{
		auto *constexpr_sampler = find_constexpr_sampler(var_id ? var_id : id);
		if (type.basetype == SPIRType::SampledImage)
		{
			// Manufacture automatic plane args for multiplanar texture
			uint32_t planes = 1;
			if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			{
				planes = constexpr_sampler->planes;
				// If this parameter isn't aliasing a global, then we need to use
				// the special "dynamic image-sampler" class to pass it--and we need
				// to use it for *every* non-alias parameter, in case a combined
				// image-sampler with a Y'CbCr conversion is passed. Hopefully, this
				// pathological case is so rare that it should never be hit in practice.
				if (!arg.alias_global_variable)
					add_spv_func_and_recompile(SPVFuncImplDynamicImageSampler);
			}
			for (uint32_t i = 1; i < planes; i++)
				arg_str += join(", ", CompilerGLSL::to_func_call_arg(arg, id), plane_name_suffix, i);
			// Manufacture automatic sampler arg if the arg is a SampledImage texture.
			if (type.image.dim != DimBuffer)
				arg_str += ", " + to_sampler_expression(var_id ? var_id : id);

			// Add sampler Y'CbCr conversion info if we have it
			if (is_dynamic_img_sampler && constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			{
				SmallVector<string> samp_args;

				switch (constexpr_sampler->resolution)
				{
				case MSL_FORMAT_RESOLUTION_444:
					// Default
					break;
				case MSL_FORMAT_RESOLUTION_422:
					samp_args.push_back("spvFormatResolution::_422");
					break;
				case MSL_FORMAT_RESOLUTION_420:
					samp_args.push_back("spvFormatResolution::_420");
					break;
				default:
					SPIRV_CROSS_THROW("Invalid format resolution.");
				}

				if (constexpr_sampler->chroma_filter != MSL_SAMPLER_FILTER_NEAREST)
					samp_args.push_back("spvChromaFilter::linear");

				if (constexpr_sampler->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN)
					samp_args.push_back("spvXChromaLocation::midpoint");
				if (constexpr_sampler->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN)
					samp_args.push_back("spvYChromaLocation::midpoint");
				switch (constexpr_sampler->ycbcr_model)
				{
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
					// Default
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_identity");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_709");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_601");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_2020");
					break;
				default:
					SPIRV_CROSS_THROW("Invalid Y'CbCr model conversion.");
				}
				if (constexpr_sampler->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_FULL)
					samp_args.push_back("spvYCbCrRange::itu_narrow");
				samp_args.push_back(join("spvComponentBits(", constexpr_sampler->bpc, ")"));
				arg_str += join(", spvYCbCrSampler(", merge(samp_args), ")");
			}
		}

		if (is_dynamic_img_sampler && constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			arg_str += join(", (uint(", create_swizzle(constexpr_sampler->swizzle[3]), ") << 24) | (uint(",
			                create_swizzle(constexpr_sampler->swizzle[2]), ") << 16) | (uint(",
			                create_swizzle(constexpr_sampler->swizzle[1]), ") << 8) | uint(",
			                create_swizzle(constexpr_sampler->swizzle[0]), ")");
		else if (msl_options.swizzle_texture_samples && has_sampled_images && is_sampled_image_type(type))
			arg_str += ", " + to_swizzle_expression(var_id ? var_id : id);

		if (buffers_requiring_array_length.count(var_id))
			arg_str += ", " + to_buffer_size_expression(var_id ? var_id : id);

		if (is_dynamic_img_sampler)
			arg_str += ")";
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(var_id);
	if (backing_var && atomic_image_vars.count(backing_var->self))
	{
		arg_str += ", " + to_expression(var_id) + "_atomic";
	}

	return arg_str;
}